

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O1

void __thiscall spdlog::logger::err_handler_(logger *this,string *msg)

{
  int iVar1;
  duration dVar2;
  char date_buf [64];
  tm tm_time;
  long local_98 [8];
  tm local_58;
  
  if ((this->custom_err_handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->custom_err_handler_)._M_invoker)
              ((_Any_data *)&this->custom_err_handler_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)msg);
    return;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&err_handler_::mutex);
  if (iVar1 == 0) {
    dVar2.__r = std::chrono::_V2::system_clock::now();
    err_handler_::err_counter = err_handler_::err_counter + 1;
    if (999999999 < dVar2.__r - (long)err_handler_::last_report_time.__d.__r) {
      local_98[0] = dVar2.__r / 1000000000;
      err_handler_::last_report_time.__d.__r = (duration)(duration)dVar2.__r;
      localtime_r(local_98,&local_58);
      strftime((char *)local_98,0x40,"%Y-%m-%d %H:%M:%S",&local_58);
      fprintf(_stderr,"[*** LOG ERROR #%04zu ***] [%s] [%s] %s\n",err_handler_::err_counter,local_98
              ,(this->name_)._M_dataplus._M_p,(msg->_M_dataplus)._M_p);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&err_handler_::mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

SPDLOG_INLINE void logger::err_handler_(const std::string &msg) {
    if (custom_err_handler_) {
        custom_err_handler_(msg);
    } else {
        using std::chrono::system_clock;
        static std::mutex mutex;
        static std::chrono::system_clock::time_point last_report_time;
        static size_t err_counter = 0;
        std::lock_guard<std::mutex> lk{mutex};
        auto now = system_clock::now();
        err_counter++;
        if (now - last_report_time < std::chrono::seconds(1)) {
            return;
        }
        last_report_time = now;
        auto tm_time = details::os::localtime(system_clock::to_time_t(now));
        char date_buf[64];
        std::strftime(date_buf, sizeof(date_buf), "%Y-%m-%d %H:%M:%S", &tm_time);
#if defined(USING_R) && defined(R_R_H)  // if in R environment
        REprintf("[*** LOG ERROR #%04zu ***] [%s] [%s] %s\n", err_counter, date_buf, name().c_str(),
                 msg.c_str());
#else
        std::fprintf(stderr, "[*** LOG ERROR #%04zu ***] [%s] [%s] %s\n", err_counter, date_buf,
                     name().c_str(), msg.c_str());
#endif
    }
}